

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnscapPlugIn.cpp
# Opt level: O1

int libithicap_start(logerr_t *a_logerr)

{
  DnsStats *pDVar1;
  
  pDVar1 = (DnsStats *)operator_new(0x1e0);
  DnsStats::DnsStats(pDVar1);
  libithicap_stats = pDVar1;
  logerr = a_logerr;
  if (libithicap_allowed != (char *)0x0) {
    AddressFilter::AddToList(&pDVar1->allowedAddresses,libithicap_allowed);
  }
  if (libithicap_banned != (char *)0x0) {
    AddressFilter::AddToList(&libithicap_stats->bannedAddresses,libithicap_banned);
  }
  if (-1 < libithicap_nb_names_in_m4) {
    libithicap_stats->max_tld_leakage_count = libithicap_nb_names_in_m4;
  }
  pDVar1 = libithicap_stats;
  libithicap_stats->capture_cache_ratio_nx_domain = (bool)libithicap_compute_nx_domain_cache;
  pDVar1->enable_frequent_address_filtering = (bool)libithicap_enable_filtering;
  if (libithicap_enable_tld_list == '\x01') {
    *(byte *)&pDVar1->dnsstat_flags = (byte)pDVar1->dnsstat_flags | 0x22;
  }
  return -(uint)(pDVar1 == (DnsStats *)0x0);
}

Assistant:

int libithicap_start(logerr_t* a_logerr)
    {
        libithicap_stats = new DnsStats();
        logerr = a_logerr;
        if (libithicap_stats) {
            if (libithicap_allowed != NULL)
            {
                libithicap_stats->allowedAddresses.AddToList(libithicap_allowed);
            }

            if (libithicap_banned != NULL)
            {
                libithicap_stats->bannedAddresses.AddToList(libithicap_banned);
            }

            if (libithicap_nb_names_in_m4 >= 0)
            {
                libithicap_stats->max_tld_leakage_count = (uint32_t)libithicap_nb_names_in_m4;
            }

            libithicap_stats->capture_cache_ratio_nx_domain = libithicap_compute_nx_domain_cache;
            libithicap_stats->enable_frequent_address_filtering = libithicap_enable_filtering;

            if (libithicap_enable_tld_list)
            {
                libithicap_stats->dnsstat_flags |= dnsStateFlagCountTld;
                libithicap_stats->dnsstat_flags |= dnsStateFlagListTldUsed;
            }

#ifdef PRIVACY_CONSCIOUS
            if (libithicap_address_list != NULL)
            {
                libithicap_stats->address_report = libithicap_address_list;
            }

            if (libithicap_name_list != NULL)
            {
                libithicap_stats->name_report = libithicap_name_list;
            }
            libithicap_stats->compress_name_and_address_reports = libithicap_compress;
#endif
        }
        return (libithicap_stats == NULL)?-1:0;
    }